

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void bitrv2(size_t n,size_t *ip,float *a)

{
  long lVar1;
  undefined8 uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  *ip = 0;
  for (uVar4 = 1; uVar4 * 8 < n; uVar4 = uVar4 * 2) {
    n = n >> 1;
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      ip[uVar4 + uVar6] = ip[uVar6] + n;
    }
  }
  if (uVar4 * 8 - n == 0) {
    for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
      lVar5 = 0;
      uVar8 = uVar6;
      while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
        lVar9 = ip[uVar6] + lVar5;
        lVar7 = *(long *)((long)ip + lVar5 * 4) + uVar6 * 2;
        uVar2 = *(undefined8 *)(a + lVar9);
        *(undefined8 *)(a + lVar9) = *(undefined8 *)(a + lVar7);
        *(undefined8 *)(a + lVar7) = uVar2;
        lVar1 = lVar9 + uVar4 * 2;
        lVar7 = lVar7 + uVar4 * 4;
        uVar2 = *(undefined8 *)(a + lVar1);
        *(undefined8 *)(a + lVar1) = *(undefined8 *)(a + lVar7);
        *(undefined8 *)(a + lVar7) = uVar2;
        lVar9 = lVar9 + uVar4 * 4;
        lVar7 = lVar7 + uVar4 * -2;
        uVar2 = *(undefined8 *)(a + lVar9);
        *(undefined8 *)(a + lVar9) = *(undefined8 *)(a + lVar7);
        *(undefined8 *)(a + lVar7) = uVar2;
        uVar2 = *(undefined8 *)(a + uVar4 * 2 + lVar9);
        *(undefined8 *)(a + uVar4 * 2 + lVar9) = *(undefined8 *)(a + uVar4 * 4 + lVar7);
        *(undefined8 *)(a + uVar4 * 4 + lVar7) = uVar2;
        lVar5 = lVar5 + 2;
      }
      lVar5 = (uVar6 + uVar4) * 2 + ip[uVar6];
      uVar2 = *(undefined8 *)(a + lVar5);
      *(undefined8 *)(a + lVar5) = *(undefined8 *)(a + uVar4 * 2 + lVar5);
      *(undefined8 *)(a + uVar4 * 2 + lVar5) = uVar2;
    }
  }
  else {
    for (uVar6 = 1; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      sVar3 = ip[uVar6];
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        lVar5 = ip[uVar8] + uVar6 * 2;
        uVar2 = *(undefined8 *)(a + sVar3 + uVar8 * 2);
        *(undefined8 *)(a + sVar3 + uVar8 * 2) = *(undefined8 *)(a + lVar5);
        *(undefined8 *)(a + lVar5) = uVar2;
        uVar2 = *(undefined8 *)(a + uVar4 * 2 + sVar3 + uVar8 * 2);
        *(undefined8 *)(a + uVar4 * 2 + sVar3 + uVar8 * 2) = *(undefined8 *)(a + uVar4 * 2 + lVar5);
        *(undefined8 *)(a + uVar4 * 2 + lVar5) = uVar2;
      }
    }
  }
  return;
}

Assistant:

static void bitrv2(size_t n, size_t *ip, float *a)
{
    size_t j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}